

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

void __thiscall CExtKey::Decode(CExtKey *this,uchar *code)

{
  uint uVar1;
  long lVar2;
  array<unsigned_char,_32UL> *t;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this->nDepth = *code;
  *(undefined4 *)this->vchFingerprint = *(undefined4 *)(code + 1);
  uVar1 = *(uint *)(code + 5);
  this->nChild = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar3 = *(undefined8 *)(code + 0x11);
  uVar4 = *(undefined8 *)(code + 0x19);
  uVar5 = *(undefined8 *)(code + 0x21);
  *(undefined8 *)(this->chaincode).super_base_blob<256U>.m_data._M_elems = *(undefined8 *)(code + 9)
  ;
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 8) = uVar3;
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10) = uVar4;
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
  CKey::Set<unsigned_char_const*>(&this->key,code + 0x2a,code + 0x4a,true);
  if (((this->nDepth == '\0') && (*(int *)this->vchFingerprint != 0 || this->nChild != 0)) ||
     (code[0x29] != '\0')) {
    (this->key).fCompressed = false;
    t = (this->key).keydata._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
    (this->key).keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (array<unsigned_char,_32UL> *)0x0;
    if (t != (array<unsigned_char,_32UL> *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&(this->key).keydata,t);
        return;
      }
      goto LAB_00156583;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00156583:
  __stack_chk_fail();
}

Assistant:

void CExtKey::Decode(const unsigned char code[BIP32_EXTKEY_SIZE]) {
    nDepth = code[0];
    memcpy(vchFingerprint, code+1, 4);
    nChild = ReadBE32(code+5);
    memcpy(chaincode.begin(), code+9, 32);
    key.Set(code+42, code+BIP32_EXTKEY_SIZE, true);
    if ((nDepth == 0 && (nChild != 0 || ReadLE32(vchFingerprint) != 0)) || code[41] != 0) key = CKey();
}